

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::InnerProduct3D_1D_1D::backward_impl
          (InnerProduct3D_1D_1D *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> TVar1;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> tdEdf;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> A;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_d8;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_c8;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> local_b8;
  undefined1 local_98 [32];
  StoragePointerType local_78;
  Dimensions local_70;
  Dimensions local_68;
  long local_60;
  StoragePointerType local_50;
  array<long,_1> aStack_48;
  IndexPair<long> local_40;
  
  local_d8 = Tensor::t<1>(dEdf);
  switch(i) {
  case 0:
    TVar1 = Tensor::t<1>((xs->
                         super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                         )._M_impl.super__Vector_impl_data._M_start[1]);
    local_98._16_16_ =
         (undefined1  [16])
         Tensor::t<1>((xs->
                      super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)
                      ._M_impl.super__Vector_impl_data._M_start[2]);
    local_98._0_8_ = local_d8.m_data;
    local_98._8_8_ = local_d8.m_dimensions.super_array<long,_1>._M_elems[0];
    local_70.super_array<long,_1>._M_elems[0] = (array<long,_1>)TVar1.m_data;
    local_68 = TVar1.m_dimensions.super_array<long,_1>._M_elems[0];
    Tensor::t<3>(&local_b8,dEdxi);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>,1>::
    operator+=((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>,1> *
               )&local_b8,
               (TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_0UL>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_0UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>
                *)local_98);
    return;
  case 1:
    Tensor::t<3>(&local_b8,
                 *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start);
    TVar1 = Tensor::t<1>((xs->
                         super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                         )._M_impl.super__Vector_impl_data._M_start[2]);
    local_78 = TVar1.m_data;
    local_70 = TVar1.m_dimensions.super_array<long,_1>._M_elems[0];
    local_68.super_array<long,_1>._M_elems[0] = (array<long,_1>)(_Type)0x1;
    break;
  case 2:
    Tensor::t<3>(&local_b8,
                 *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start);
    TVar1 = Tensor::t<1>((xs->
                         super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                         )._M_impl.super__Vector_impl_data._M_start[1]);
    local_78 = TVar1.m_data;
    local_70 = TVar1.m_dimensions.super_array<long,_1>._M_elems[0];
    local_68.super_array<long,_1>._M_elems[0] = (array<long,_1>)(_Type)0x2;
    break;
  case 3:
    local_98._0_16_ = (undefined1  [16])Tensor::t<1>(dEdxi);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,1>::
    operator+=((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,1> *
               )local_98,&local_d8);
    return;
  default:
    std::operator<<((ostream *)&std::cerr,"shouldn\'t happen\n");
    abort();
  }
  local_60 = 0;
  local_50 = local_d8.m_data;
  aStack_48._M_elems[0] = (_Type)(_Type)local_d8.m_dimensions.super_array<long,_1>._M_elems[0];
  local_40 = (IndexPair<long>)(ZEXT816(0) << 0x20);
  local_c8 = Tensor::t<1>(dEdxi);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,1>::
  operator+=((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,1> *)
             &local_c8,
             (TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>
              *)local_98);
  return;
}

Assistant:

void InnerProduct3D_1D_1D::backward_impl(const vector<const Tensor*>& xs,
                     const Tensor& fx,
                     const Tensor& dEdf,
                     unsigned i,
                     Tensor& dEdxi) const {
  auto tdEdf = dEdf.t<1>();  // vector
  typedef Eigen::Tensor<float, 1>::DimensionPair DimPair;
  if (i == 0) { // 3 tensor
    // tensor product
    auto b = xs[1]->t<1>();
    auto c = xs[2]->t<1>();
    dEdxi.t<3>() += tdEdf.contract(c, Eigen::array<DimPair, 0>{{}}).contract(b, Eigen::array<DimPair, 0>{{}});
  } else if (i == 1) { // vector 1
    // TODO these should be reorganized so the contraction is first with tdEdf and then with c or b.
    // in theory, that intermediate result could be cached (although CNN doesn't support this). the fact that it
    // this part of the product is redone when i=1 and again when i=2 is probably why this is slower
    // (or maybe it's the contract implementation?)
    Eigen::array<DimPair, 1> dims({{DimPair(1, 0)}});
    Eigen::array<DimPair, 1> dims2({{DimPair(0, 0)}});
    auto A = xs[0]->t<3>();
    auto c = xs[2]->t<1>();
    dEdxi.t<1>() += A.contract(c, dims).contract(tdEdf, dims2);
  } else if (i == 2) { // vector 2
    Eigen::array<DimPair, 1> dims({{DimPair(2, 0)}});
    Eigen::array<DimPair, 1> dims2({{DimPair(0, 0)}});
    auto A = xs[0]->t<3>();
    auto b = xs[1]->t<1>();
    dEdxi.t<1>() += A.contract(b, dims).contract(tdEdf, dims2);
  } else if (i == 3) { // vector bias
    dEdxi.t<1>() += tdEdf;
  } else {
    cerr << "shouldn't happen\n"; abort();
  }
}